

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O2

int Saig_ManCallSolver(Gia_ManBmc_t *p,int Lit)

{
  int iVar1;
  int Lit_local;
  
  if (Lit == 0) {
    iVar1 = -1;
  }
  else if (Lit == 1) {
    iVar1 = 1;
  }
  else {
    Lit_local = Lit;
    if (p->pSat2 == (satoko_t *)0x0) {
      if (p->pSat3 == (bmcg_sat_solver *)0x0) {
        iVar1 = sat_solver_solve(p->pSat,&Lit_local,(lit *)&stack0xfffffffffffffff8,
                                 (long)p->pPars->nConfLimit,0,0,0);
      }
      else {
        bmcg_sat_solver_set_conflict_budget(p->pSat3,p->pPars->nConfLimit);
        iVar1 = bmcg_sat_solver_solve(p->pSat3,&Lit_local,1);
      }
    }
    else {
      iVar1 = satoko_solve_assumptions_limit(p->pSat2,&Lit_local,1,p->pPars->nConfLimit);
    }
  }
  return iVar1;
}

Assistant:

int Saig_ManCallSolver( Gia_ManBmc_t * p, int Lit )
{
    if ( Lit == 0 )
        return l_False;
    if ( Lit == 1 )
        return l_True;
    if ( p->pSat2 )
        return satoko_solve_assumptions_limit( p->pSat2, &Lit, 1, p->pPars->nConfLimit );
    else if ( p->pSat3 )
    {
        bmcg_sat_solver_set_conflict_budget( p->pSat3, p->pPars->nConfLimit );
        return bmcg_sat_solver_solve( p->pSat3, &Lit, 1 );
    }
    else
        return sat_solver_solve( p->pSat, &Lit, &Lit + 1, (ABC_INT64_T)p->pPars->nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
}